

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

int formatf(void *userp,_func_int_uchar_void_ptr *stream,char *format,__va_list_tag *ap_save)

{
  long lVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  double *pdVar9;
  size_t sVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  char *__s;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  double dVar20;
  uint *puVar21;
  double *pdVar22;
  double dVar23;
  byte *input_00;
  uint uVar24;
  uint uVar25;
  byte bVar26;
  uint uVar27;
  size_t maxlength;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  char formatbuf [32];
  char work [326];
  va_input input [128];
  outsegment output [128];
  ulong local_19f8;
  char *local_19f0;
  ulong local_19d0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  __va_list_tag *local_1990;
  byte local_1988 [336];
  int local_1838 [2];
  double local_1830 [255];
  uint local_1038 [2];
  undefined8 local_1030;
  long local_1028 [511];
  
  local_1988[0] = 0;
  local_1988[1] = 0;
  local_1988[2] = 0;
  local_1988[3] = 0;
  local_1988[4] = 0;
  local_1988[5] = 0;
  local_1988[6] = 0;
  local_1988[7] = 0;
  local_1988[8] = 0;
  local_1988[9] = 0;
  local_1988[10] = 0;
  local_1988[0xb] = 0;
  local_1988[0xc] = 0;
  local_1988[0xd] = 0;
  local_1988[0xe] = 0;
  local_1988[0xf] = 0;
  uVar24 = 0;
  local_19f8 = 0xffffffff;
  iVar6 = 0;
  local_19d0 = 0;
  local_19b8 = (byte *)format;
switchD_00140182_caseD_68:
  if (*local_19b8 != 0x25) {
    if (*local_19b8 != 0) goto code_r0x001400f7;
    if ((long)local_19b8 - (long)format != 0) {
      if (0x7f < (int)uVar24) {
        return 0;
      }
      lVar12 = (long)(int)uVar24;
      uVar24 = uVar24 + 1;
      (&local_1030)[lVar12 * 4] = 0x100000;
      local_1028[lVar12 * 4] = (long)format;
      local_1028[lVar12 * 4 + 1] = (long)local_19b8 - (long)format;
    }
    if (-1 < (int)local_19f8) {
      pdVar9 = local_1830;
      uVar13 = 0;
      do {
        if ((local_1988[uVar13 >> 3 & 0x1fffffff] >> ((uint)uVar13 & 7) & 1) == 0) {
          return 0;
        }
        switch(*(undefined4 *)(pdVar9 + -1)) {
        case 0:
        case 1:
        case 2:
        case 4:
        case 5:
        case 7:
        case 8:
          uVar27 = ap_save->gp_offset;
          if ((ulong)uVar27 < 0x29) {
            pdVar22 = (double *)((ulong)uVar27 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar27 + 8;
          }
          else {
            pdVar22 = (double *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = pdVar22 + 1;
          }
          dVar20 = *pdVar22;
          break;
        case 3:
        case 0xb:
        case 0xc:
          uVar27 = ap_save->gp_offset;
          if ((ulong)uVar27 < 0x29) {
            piVar19 = (int *)((ulong)uVar27 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar27 + 8;
          }
          else {
            piVar19 = (int *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = piVar19 + 2;
          }
          dVar20 = (double)(long)*piVar19;
          break;
        case 6:
          uVar27 = ap_save->gp_offset;
          if ((ulong)uVar27 < 0x29) {
            puVar21 = (uint *)((ulong)uVar27 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar27 + 8;
          }
          else {
            puVar21 = (uint *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = puVar21 + 2;
          }
          dVar20 = (double)(ulong)*puVar21;
          break;
        case 9:
          uVar27 = ap_save->fp_offset;
          if ((ulong)uVar27 < 0xa1) {
            pdVar22 = (double *)((ulong)uVar27 + (long)ap_save->reg_save_area);
            ap_save->fp_offset = uVar27 + 0x10;
          }
          else {
            pdVar22 = (double *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = pdVar22 + 1;
          }
          *pdVar9 = *pdVar22;
        default:
          goto switchD_0014056e_caseD_a;
        }
        *pdVar9 = dVar20;
switchD_0014056e_caseD_a:
        uVar13 = uVar13 + 1;
        pdVar9 = pdVar9 + 2;
      } while ((int)local_19f8 + 1 != uVar13);
    }
    if ((int)uVar24 < 1) {
      return 0;
    }
    local_19f0 = "0123456789abcdefghijklmnopqrstuvwxyz";
    uVar13 = 0;
    iVar6 = 0;
    do {
      lVar12 = local_1028[uVar13 * 4 + 1];
      uVar27 = *(uint *)(&local_1030 + uVar13 * 4);
      iVar5 = iVar6;
      if (lVar12 != 0) {
        lVar1 = local_1028[uVar13 * 4];
        lVar17 = 0;
        do {
          iVar5 = (int)lVar17;
          if (*(uchar *)(lVar1 + lVar17) == '\0') break;
          iVar5 = (*stream)(*(uchar *)(lVar1 + lVar17),userp);
          if (iVar5 != 0) {
            return iVar6 + (int)lVar17;
          }
          lVar17 = lVar17 + 1;
          iVar5 = (int)lVar12;
        } while (lVar12 != lVar17);
        iVar6 = iVar6 + iVar5;
        iVar5 = iVar6;
        if ((uVar27 >> 0x14 & 1) == 0) goto LAB_001406c8;
        goto switchD_00140770_default;
      }
LAB_001406c8:
      uVar4 = local_1038[uVar13 * 8];
      if ((uVar27 >> 0xe & 1) == 0) {
        uVar18 = (ulong)uVar4;
      }
      else {
        uVar28 = *(uint *)(local_1830 + (long)(int)uVar4 * 2);
        uVar18 = (ulong)uVar28;
        if ((int)uVar28 < 0) {
          uVar18 = (ulong)-uVar28;
          uVar27 = uVar27 & 0xfffffefb | 4;
        }
      }
      iVar15 = (int)uVar18;
      if ((uVar27 >> 0x10 & 1) == 0) {
        uVar28 = 0xffffffff;
        if ((short)uVar27 < 0) {
          uVar28 = local_1038[uVar13 * 8 + 1];
        }
      }
      else {
        uVar28 = *(uint *)(local_1830 + (long)(int)local_1038[uVar13 * 8 + 1] * 2);
        if ((int)uVar28 < 0) {
          uVar28 = 0xffffffff;
        }
      }
      uVar29 = (ulong)*(uint *)((long)local_1028 + uVar13 * 0x20 + -4);
      uVar25 = uVar27;
      iVar6 = iVar5;
      switch(local_1838[uVar29 * 4]) {
      case 0:
        __s = (char *)local_1830[uVar29 * 2];
        if (__s == (char *)0x0) {
          if (uVar28 != 0xffffffff && (int)uVar28 < 5) {
            __s = "";
LAB_00140eb7:
            sVar10 = 0;
            goto LAB_00140eba;
          }
          uVar27 = uVar27 & 0xfffffff7;
          iVar7 = iVar15 + -5;
          sVar10 = 5;
          iVar6 = 5;
          bVar30 = true;
          __s = "(nil)";
        }
        else {
          if (uVar28 == 0xffffffff) {
            if (*__s == '\0') goto LAB_00140eb7;
            sVar10 = strlen(__s);
          }
          else {
            sVar10 = (size_t)(int)uVar28;
          }
LAB_00140eba:
          uVar18 = 0x7fffffff;
          if (sVar10 < 0x7fffffff) {
            uVar18 = sVar10;
          }
          iVar6 = (int)uVar18;
          iVar7 = iVar15 - iVar6;
          bVar30 = true;
          if ((uVar27 & 8) != 0) {
            iVar16 = (*stream)('\"',userp);
            if (iVar16 != 0) {
              return iVar5;
            }
            iVar5 = iVar5 + 1;
            bVar30 = false;
          }
        }
        if ((uVar27 & 4) == 0) {
          if (iVar7 < 1) {
            iVar7 = iVar7 + -1;
          }
          else {
            iVar15 = iVar15 + iVar5;
            do {
              iVar16 = (*stream)(' ',userp);
              if (iVar16 != 0) {
                return iVar5;
              }
              iVar5 = iVar5 + 1;
              iVar16 = iVar7 + -1;
              bVar31 = 0 < iVar7;
              iVar7 = iVar16;
            } while (iVar16 != 0 && bVar31);
            iVar7 = -1;
            iVar5 = iVar15 - iVar6;
          }
        }
        if (sVar10 != 0) {
          uVar18 = 0;
          do {
            iVar6 = (int)uVar18;
            if (__s[uVar18] == '\0') break;
            iVar6 = (*stream)(__s[uVar18],userp);
            if (iVar6 != 0) {
              return iVar5 + (int)uVar18;
            }
            uVar18 = uVar18 + 1;
            iVar6 = (int)sVar10;
          } while (sVar10 != uVar18);
          iVar5 = iVar5 + iVar6;
        }
        iVar6 = iVar5;
        if (((uVar27 & 4) != 0) && (0 < iVar7)) {
          iVar6 = iVar7 + iVar5;
          iVar7 = iVar7 + 1;
          do {
            iVar15 = (*stream)(' ',userp);
            if (iVar15 != 0) {
              return iVar5;
            }
            iVar5 = iVar5 + 1;
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
        }
        if (!bVar30) {
          iVar5 = (*stream)('\"',userp);
          if (iVar5 != 0) {
            return iVar6;
          }
          iVar6 = iVar6 + 1;
        }
        break;
      case 1:
        dVar20 = local_1830[uVar29 * 2];
        if (dVar20 == 0.0) {
          iVar7 = iVar15 + -5;
          if ((uVar27 & 4) != 0) {
            if (iVar15 < 6) {
              iVar7 = iVar15 + -6;
            }
            else {
              iVar6 = iVar7 + iVar5;
              do {
                iVar15 = (*stream)(' ',userp);
                if (iVar15 != 0) {
                  return iVar5;
                }
                iVar5 = iVar5 + 1;
                iVar7 = iVar7 + -1;
              } while (0 < iVar7);
              iVar7 = -1;
              iVar5 = iVar6;
            }
          }
          iVar15 = iVar5 + 5;
          uVar3 = '(';
          lVar12 = 0;
          do {
            iVar6 = (*stream)(uVar3,userp);
            if (iVar6 != 0) {
              return iVar5 + (int)lVar12;
            }
            uVar3 = "(nil)"[lVar12 + 1];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 5);
          iVar6 = iVar15;
          if (((uVar27 & 4) == 0) && (0 < iVar7)) {
            iVar6 = iVar15 + iVar7;
            iVar7 = iVar7 + 1;
            do {
              iVar5 = (*stream)(' ',userp);
              if (iVar5 != 0) {
                return iVar15;
              }
              iVar15 = iVar15 + 1;
              iVar7 = iVar7 + -1;
            } while (1 < iVar7);
          }
          break;
        }
        local_19f0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar27 >> 0xc & 1) == 0) {
          local_19f0 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        bVar26 = 1;
        dVar23 = 7.90505033345994e-323;
        bVar11 = 0;
        bVar2 = 1;
        goto LAB_00140a4e;
      case 2:
        if (((uVar27 & 0x40) == 0) && ((uVar27 & 0x20) == 0)) {
          if ((uVar27 & 0x10) == 0) {
            *(int *)local_1830[uVar29 * 2] = iVar5;
          }
          else {
            *(short *)local_1830[uVar29 * 2] = (short)iVar5;
          }
        }
        else {
          *(long *)local_1830[uVar29 * 2] = (long)iVar5;
        }
        break;
      case 3:
      case 4:
      case 5:
        goto switchD_00140770_caseD_3;
      case 6:
      case 7:
      case 8:
        uVar25 = uVar27 | 0x200;
switchD_00140770_caseD_3:
        dVar20 = local_1830[uVar29 * 2];
        if ((uVar25 >> 0x11 & 1) == 0) {
          bVar2 = (byte)((uVar27 & 8) >> 3);
          uVar27 = uVar25;
          if ((uVar25 >> 10 & 1) == 0) {
            if ((uVar25 >> 0xb & 1) != 0) {
              local_19f0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
              if ((uVar25 >> 0xc & 1) == 0) {
                local_19f0 = "0123456789abcdefghijklmnopqrstuvwxyz";
              }
              bVar26 = 1;
              dVar23 = 7.90505033345994e-323;
              bVar11 = 0;
              goto LAB_00140a4e;
            }
            dVar23 = (double)-(long)dVar20;
            if (0 < (long)dVar20) {
              dVar23 = dVar20;
            }
            bVar30 = (uVar25 >> 9 & 1) == 0;
            if (!bVar30) {
              dVar23 = dVar20;
            }
            if (uVar28 == 0xffffffff) {
              uVar28 = 1;
            }
            uVar18 = 0x144;
            if (dVar23 != 0.0) {
              do {
                local_1988[uVar18] = SUB81(dVar23,0) + (char)((ulong)dVar23 / 10) * -10 | 0x30;
                uVar18 = uVar18 - 1;
                bVar31 = 9 < (ulong)dVar23;
                dVar23 = (double)((ulong)dVar23 / 10);
              } while (bVar31);
            }
            bVar30 = bVar30 && (long)dVar20 < 0;
            iVar6 = 0x144 - (int)uVar18;
            iVar15 = iVar15 - iVar6;
            iVar6 = uVar28 - iVar6;
            bVar26 = 0;
LAB_00140acc:
            if ((0 < iVar6) && (iVar15 = iVar15 - iVar6, -1 < (long)uVar18)) {
              uVar29 = (ulong)(((int)uVar18 + uVar28) - 0x145);
              if (uVar18 < uVar29) {
                uVar29 = uVar18;
              }
              memset(local_1988 + (uVar18 - uVar29),0x30,uVar29 + 1);
              uVar18 = uVar18 + ~uVar29;
            }
          }
          else {
            bVar11 = 1;
            dVar23 = 3.95252516672997e-323;
            bVar26 = 0;
LAB_00140a4e:
            if (uVar28 == 0xffffffff) {
              uVar28 = 1;
            }
            if (dVar20 == 0.0) {
              uVar18 = 0x144;
            }
            else {
              uVar18 = 0x144;
              do {
                local_1988[uVar18] = local_19f0[(ulong)dVar20 & (long)dVar23 - 1U];
                uVar18 = uVar18 - 1;
                bVar30 = (ulong)dVar23 <= (ulong)dVar20;
                dVar20 = (double)((ulong)dVar20 / (ulong)dVar23);
              } while (bVar30);
            }
            iVar6 = 0x144 - (int)uVar18;
            iVar15 = iVar15 - iVar6;
            iVar6 = uVar28 - iVar6;
            bVar30 = false;
            if (((bVar11 & bVar2) != 1) || (0 < iVar6)) goto LAB_00140acc;
            local_1988[uVar18] = 0x30;
            uVar18 = uVar18 - 1;
            iVar15 = iVar15 + -1;
            bVar30 = false;
          }
          iVar6 = iVar15 + -2;
          if ((bVar2 & bVar26) == 0) {
            iVar6 = iVar15;
          }
          uVar4 = (uint)(byte)((uVar27 & 3) != 0 | bVar30);
          iVar15 = iVar6 - uVar4;
          if ((uVar27 & 0x104) == 0) {
            if (iVar15 < 1) {
              iVar15 = iVar15 + -1;
            }
            else {
              iVar6 = iVar6 + iVar5;
              do {
                iVar7 = (*stream)(' ',userp);
                if (iVar7 != 0) {
                  return iVar5;
                }
                iVar5 = iVar5 + 1;
                iVar7 = iVar15 + -1;
                bVar31 = 0 < iVar15;
                iVar15 = iVar7;
              } while (iVar7 != 0 && bVar31);
              iVar15 = -1;
              iVar5 = iVar6 - uVar4;
            }
          }
          if (bVar30 == false) {
            if ((uVar27 & 2) != 0) {
              uVar3 = '+';
              goto LAB_00140d03;
            }
            if ((uVar27 & 1) != 0) {
              uVar3 = ' ';
              goto LAB_00140d03;
            }
          }
          else {
            uVar3 = '-';
LAB_00140d03:
            iVar6 = (*stream)(uVar3,userp);
            if (iVar6 != 0) {
              return iVar5;
            }
            iVar5 = iVar5 + 1;
          }
          if ((bVar2 & bVar26) != 0) {
            iVar6 = (*stream)('0',userp);
            if (iVar6 != 0) {
              return iVar5;
            }
            if ((uVar27 >> 0xc & 1) == 0) {
              uVar3 = 'x';
            }
            else {
              uVar3 = 'X';
            }
            iVar6 = (*stream)(uVar3,userp);
            if (iVar6 != 0) {
              return iVar5 + 1;
            }
            iVar5 = iVar5 + 2;
          }
          if ((uVar27 & 0x104) == 0x100) {
            if (iVar15 < 1) {
              iVar15 = iVar15 + -1;
            }
            else {
              iVar6 = iVar5 + iVar15;
              do {
                iVar7 = (*stream)('0',userp);
                if (iVar7 != 0) {
                  return iVar5;
                }
                iVar5 = iVar5 + 1;
                iVar7 = iVar15 + -1;
                bVar30 = 0 < iVar15;
                iVar15 = iVar7;
              } while (iVar7 != 0 && bVar30);
              iVar15 = -1;
              iVar5 = iVar6;
            }
          }
          iVar7 = iVar5;
          if ((long)uVar18 < 0x144) {
            iVar7 = (iVar5 - (int)uVar18) + 0x144;
            do {
              iVar6 = (*stream)(local_1988[uVar18 + 1],userp);
              if (iVar6 != 0) {
                return iVar5;
              }
              uVar18 = uVar18 + 1;
              iVar5 = iVar5 + 1;
            } while (uVar18 != 0x144);
          }
          iVar6 = iVar7;
          if (((uVar27 & 4) != 0) && (0 < iVar15)) {
            iVar6 = iVar15 + iVar7;
            iVar15 = iVar15 + 1;
            do {
              iVar5 = (*stream)(' ',userp);
              if (iVar5 != 0) {
                return iVar7;
              }
              iVar7 = iVar7 + 1;
              iVar15 = iVar15 + -1;
            } while (1 < iVar15);
          }
        }
        else {
          iVar7 = iVar15;
          if (((uVar25 & 4) == 0) && (iVar7 = iVar15 + -1, 1 < iVar15)) {
            iVar7 = iVar7 + iVar5;
            do {
              iVar6 = (*stream)(' ',userp);
              if (iVar6 != 0) {
                return iVar5;
              }
              iVar5 = iVar5 + 1;
              uVar27 = (int)uVar18 - 1;
              uVar18 = (ulong)uVar27;
            } while (1 < (int)uVar27);
            iVar5 = iVar7;
            iVar7 = 0;
          }
          iVar6 = (*stream)(SUB81(dVar20,0),userp);
          if (iVar6 != 0) {
            return iVar5;
          }
          iVar15 = iVar5 + 1;
          iVar6 = iVar15;
          if (((uVar25 & 4) != 0) && (1 < iVar7)) {
            iVar16 = iVar7 + 1;
            do {
              iVar6 = (*stream)(' ',userp);
              if (iVar6 != 0) {
                return iVar15;
              }
              iVar15 = iVar15 + 1;
              iVar16 = iVar16 + -1;
              iVar6 = iVar5 + iVar7;
            } while (2 < iVar16);
          }
        }
        break;
      case 9:
        local_19a8 = 0;
        uStack_19a0 = 0;
        local_19b8 = (byte *)0x25;
        uStack_19b0 = 0;
        sVar10 = strlen((char *)&local_19b8);
        uVar14 = (ulong)uVar4;
        if ((uVar27 >> 0xd & 1) == 0) {
          uVar14 = uVar18;
        }
        uVar4 = (uint)uVar14;
        if ((short)uVar27 < 0) {
          uVar28 = local_1038[uVar13 * 8 + 1];
        }
        pbVar8 = (byte *)((long)&local_19b8 + 1);
        if ((uVar27 & 4) != 0) {
          local_19b8._0_2_ = CONCAT11(0x2d,(char)local_19b8);
          pbVar8 = (byte *)((long)&local_19b8 + 2);
        }
        if ((uVar27 & 2) != 0) {
          *pbVar8 = 0x2b;
          pbVar8 = pbVar8 + 1;
        }
        if ((uVar27 & 1) != 0) {
          *pbVar8 = 0x20;
          pbVar8 = pbVar8 + 1;
        }
        if ((uVar27 & 8) != 0) {
          *pbVar8 = 0x23;
          pbVar8 = pbVar8 + 1;
        }
        maxlength = 0x20 - sVar10;
        *pbVar8 = 0;
        if (-1 < (int)uVar4) {
          if (0x144 < uVar4) {
            uVar14 = 0x145;
          }
          uVar4 = (uint)uVar14;
          iVar6 = curl_msnprintf((char *)pbVar8,maxlength,"%d",uVar14);
          pbVar8 = pbVar8 + iVar6;
          maxlength = maxlength - (long)iVar6;
        }
        if (-1 < (int)uVar28) {
          dVar20 = local_1830[uVar29 * 2];
          iVar6 = 0x144 - uVar4;
          if ((int)uVar4 < (int)uVar28) {
            iVar6 = 0x144;
          }
          if ((int)uVar4 < 1) {
            iVar6 = 0x144;
          }
          for (; 10.0 <= dVar20; dVar20 = dVar20 / 10.0) {
            iVar6 = iVar6 + -1;
          }
          uVar4 = iVar6 - 1;
          if ((int)uVar28 <= iVar6) {
            uVar4 = uVar28;
          }
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          iVar6 = curl_msnprintf((char *)pbVar8,maxlength,".%d",(ulong)uVar4);
          pbVar8 = pbVar8 + iVar6;
        }
        if ((uVar27 & 0x20) != 0) {
          *pbVar8 = 0x6c;
          pbVar8 = pbVar8 + 1;
        }
        if ((uVar27 >> 0x12 & 1) == 0) {
          bVar2 = 0x66;
          if ((uVar27 >> 0x13 & 1) != 0) {
            bVar2 = ((uVar27 >> 0xc & 1) == 0) << 5 | 0x47;
          }
        }
        else {
          bVar2 = ((uVar27 >> 0xc & 1) == 0) << 5 | 0x45;
        }
        *pbVar8 = bVar2;
        pbVar8[1] = 0;
        snprintf((char *)local_1988,0x146,(char *)&local_19b8,SUB84(local_1830[uVar29 * 2],0));
        pbVar8 = local_1988;
        bVar2 = local_1988[0];
        while (pbVar8 = pbVar8 + 1, iVar6 = iVar5, bVar2 != 0) {
          iVar6 = (*stream)(bVar2,userp);
          if (iVar6 != 0) {
            return iVar5;
          }
          iVar5 = iVar5 + 1;
          bVar2 = *pbVar8;
        }
      }
switchD_00140770_default:
      uVar13 = uVar13 + 1;
      if (uVar13 == uVar24) {
        return iVar6;
      }
    } while( true );
  }
  pbVar8 = local_19b8 + 1;
  if (local_19b8[1] == 0x25) {
    if (pbVar8 + ~(ulong)format != (byte *)0x0) {
      if (0x7f < (int)uVar24) {
        return 0;
      }
      lVar12 = (long)(int)uVar24;
      uVar24 = uVar24 + 1;
      (&local_1030)[lVar12 * 4] = 0x100000;
      local_1028[lVar12 * 4] = (long)format;
      local_1028[lVar12 * 4 + 1] = (long)(pbVar8 + ~(ulong)format);
    }
    format = (char *)pbVar8;
    local_19b8 = local_19b8 + 2;
    goto switchD_00140182_caseD_68;
  }
  uVar27 = 0;
  local_19b8 = pbVar8;
  if (iVar6 == 1) {
LAB_0013fe8f:
    uVar13 = 0xffffffff;
    bVar30 = false;
    iVar6 = 1;
  }
  else {
    uVar4 = dollarstring((char *)pbVar8,(char **)&local_19b8);
    if ((int)uVar4 < 0) {
      if (iVar6 == 2) {
        return 0;
      }
      goto LAB_0013fe8f;
    }
    iVar6 = 2;
    bVar30 = true;
    uVar13 = (ulong)uVar4;
  }
  uVar29 = 0;
  uVar18 = 0;
LAB_0013fe9e:
  while( true ) {
    uVar28 = (uint)uVar29;
    uVar4 = (uint)uVar18;
    input_00 = local_19b8 + 1;
    bVar2 = *local_19b8;
    if (bVar2 < 0x4c) break;
    if (bVar2 < 0x6c) {
      if (bVar2 == 0x4c) {
        uVar27 = uVar27 | 0x80;
        local_19b8 = input_00;
      }
      else if (bVar2 == 0x4f) {
LAB_00140067:
        uVar27 = uVar27 | 0x20;
        local_19b8 = input_00;
      }
      else {
        if (bVar2 != 0x68) goto switchD_0013fecb_caseD_21;
        uVar27 = uVar27 | 0x10;
        local_19b8 = input_00;
      }
    }
    else {
      if (bVar2 == 0x6c) {
        if ((uVar27 & 0x20) != 0) goto LAB_00140070;
        goto LAB_00140067;
      }
      if (bVar2 != 0x71) {
        if (bVar2 == 0x7a) goto LAB_00140067;
        goto switchD_0013fecb_caseD_21;
      }
LAB_00140070:
      uVar27 = uVar27 | 0x40;
      local_19b8 = input_00;
    }
  }
  switch(bVar2) {
  case 0x20:
    uVar27 = uVar27 | 1;
    local_19b8 = input_00;
    goto LAB_0013fe9e;
  case 0x23:
    uVar27 = uVar27 | 8;
    local_19b8 = input_00;
    goto LAB_0013fe9e;
  case 0x2a:
    uVar27 = uVar27 | 0x4000;
    uVar18 = 0xffffffff;
    local_19b8 = input_00;
    if (bVar30) {
      uVar4 = dollarstring((char *)input_00,(char **)&local_19b8);
      uVar18 = (ulong)uVar4;
      if ((int)uVar4 < 0) {
        return 0;
      }
    }
    goto LAB_0013fe9e;
  case 0x2b:
    uVar27 = uVar27 | 2;
    local_19b8 = input_00;
    goto LAB_0013fe9e;
  case 0x2d:
    uVar27 = uVar27 & 0xfffffefb | 4;
    local_19b8 = input_00;
    goto LAB_0013fe9e;
  case 0x2e:
    bVar2 = *input_00;
    if (bVar2 == 0x2a) {
      uVar27 = uVar27 | 0x10000;
      local_19b8 = local_19b8 + 2;
      uVar29 = 0xffffffff;
      if (bVar30) {
        local_1990 = ap_save;
        uVar4 = dollarstring((char *)local_19b8,(char **)&local_19b8);
        uVar29 = (ulong)uVar4;
        ap_save = local_1990;
        if ((int)uVar4 < 0) {
          return 0;
        }
      }
    }
    else {
      bVar11 = bVar2;
      if (bVar2 == 0x2d) {
        bVar11 = local_19b8[2];
        input_00 = local_19b8 + 2;
      }
      uVar4 = 0;
      if ((byte)(bVar11 - 0x30) < 10) {
        uVar4 = 0;
        do {
          if (0xccccccc < (int)uVar4) {
            return 0;
          }
          uVar4 = (uint)(byte)(bVar11 - 0x30) + uVar4 * 10;
          bVar11 = input_00[1];
          input_00 = input_00 + 1;
        } while ((byte)(bVar11 - 0x30) < 10);
      }
      uVar27 = uVar27 | 0x8000;
      uVar29 = (ulong)-uVar4;
      local_19b8 = input_00;
      if (bVar2 != 0x2d) {
        uVar29 = (ulong)uVar4;
      }
    }
    if ((~uVar27 & 0x18000) == 0) {
      return 0;
    }
    goto LAB_0013fe9e;
  case 0x30:
    uVar27 = uVar27 | (~uVar27 & 4) << 6;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    uVar27 = uVar27 | 0x2000;
    uVar18 = 0;
    do {
      if (0xccccccc < (int)uVar18) {
        return 0;
      }
      uVar18 = (ulong)(((uint)bVar2 + (int)uVar18 * 10) - 0x30);
      bVar2 = local_19b8[1];
      local_19b8 = local_19b8 + 1;
    } while ((byte)(bVar2 - 0x30) < 10);
    goto LAB_0013fe9e;
  }
switchD_0013fecb_caseD_21:
  if (bVar2 < 0x58) {
    if (bVar2 == 0x45) {
      pbVar8 = pbVar8 + ~(ulong)format;
      uVar27 = uVar27 | 0x41000;
      goto LAB_001402d7;
    }
    if (bVar2 != 0x47) {
      if (bVar2 == 0x53) {
        uVar27 = uVar27 | 8;
        goto LAB_00140279;
      }
      goto switchD_00140182_caseD_68;
    }
    pbVar8 = pbVar8 + ~(ulong)format;
    uVar27 = uVar27 | 0x81000;
LAB_001402d7:
    iVar5 = 9;
  }
  else {
    switch(bVar2) {
    case 99:
      uVar27 = uVar27 | 0x20000;
      goto LAB_00140307;
    case 100:
    case 0x69:
      pbVar8 = pbVar8 + ~(ulong)format;
      iVar5 = 5;
      if ((uVar27 & 0x40) == 0) {
        iVar5 = 4 - (uint)((uVar27 & 0x20) == 0);
      }
      break;
    case 0x65:
      pbVar8 = pbVar8 + ~(ulong)format;
      uVar27 = uVar27 | 0x40000;
      goto LAB_001402d7;
    case 0x66:
      pbVar8 = pbVar8 + ~(ulong)format;
      goto LAB_001402d7;
    case 0x67:
      pbVar8 = pbVar8 + ~(ulong)format;
      uVar27 = uVar27 | 0x80000;
      goto LAB_001402d7;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
      goto switchD_00140182_caseD_68;
    case 0x6e:
      pbVar8 = pbVar8 + ~(ulong)format;
      iVar5 = 2;
      break;
    case 0x6f:
      uVar27 = uVar27 | 0x400;
LAB_00140307:
      pbVar8 = pbVar8 + ~(ulong)format;
      iVar5 = 3;
      break;
    case 0x70:
      pbVar8 = pbVar8 + ~(ulong)format;
      iVar5 = 1;
      break;
    case 0x73:
LAB_00140279:
      pbVar8 = pbVar8 + ~(ulong)format;
      iVar5 = 0;
      break;
    case 0x75:
      pbVar8 = pbVar8 + ~(ulong)format;
      iVar5 = 7 - (uint)((uVar27 & 0x20) == 0);
      if ((uVar27 & 0x40) != 0) {
        iVar5 = 8;
      }
      uVar27 = uVar27 | 0x200;
      break;
    case 0x78:
      uVar27 = uVar27 | 0xa00;
      goto LAB_001402ef;
    default:
      if (bVar2 != 0x58) goto switchD_00140182_caseD_68;
      uVar27 = uVar27 | 0x1a00;
LAB_001402ef:
      pbVar8 = pbVar8 + ~(ulong)format;
      iVar5 = 6;
    }
  }
  if ((uVar27 >> 0xe & 1) != 0) {
    if ((int)uVar4 < 0) {
      uVar18 = local_19d0;
      local_19d0 = (ulong)((int)local_19d0 + 1);
    }
    else if ((local_1988[uVar18 >> 3] >> (uVar4 & 7) & 1) != 0) {
      return 0;
    }
    uVar4 = (uint)uVar18;
    if (0x7f < (int)uVar4) {
      return 0;
    }
    bVar30 = (int)local_19f8 < (int)uVar4;
    if (bVar30) {
      local_19f8 = uVar18;
    }
    local_1838[(long)(int)uVar4 * 4] = 0xb;
    uVar25 = uVar4 + 7;
    if (-1 < (int)uVar4) {
      uVar25 = uVar4;
    }
    local_1988[(int)uVar25 >> 3] = local_1988[(int)uVar25 >> 3] | (byte)(1 << ((byte)uVar18 & 7));
  }
  if ((uVar27 >> 0x10 & 1) != 0) {
    if ((int)uVar28 < 0) {
      uVar29 = local_19d0;
      local_19d0 = (ulong)((int)local_19d0 + 1);
    }
    else if ((local_1988[uVar29 >> 3] >> (uVar28 & 7) & 1) != 0) {
      return 0;
    }
    uVar28 = (uint)uVar29;
    if (0x7f < (int)uVar28) {
      return 0;
    }
    if ((int)local_19f8 < (int)uVar28) {
      local_19f8 = uVar29;
    }
    local_1838[(long)(int)uVar28 * 4] = 0xc;
    uVar25 = uVar28 + 7;
    if (-1 < (int)uVar28) {
      uVar25 = uVar28;
    }
    local_1988[(int)uVar25 >> 3] = local_1988[(int)uVar25 >> 3] | (byte)(1 << ((byte)uVar29 & 7));
  }
  uVar18 = uVar13;
  if ((int)uVar13 < 0) {
    uVar18 = local_19d0;
  }
  iVar15 = (int)uVar18;
  if (0x7f < iVar15) {
    return 0;
  }
  iVar7 = iVar15 + 7;
  if (-1 < iVar15) {
    iVar7 = iVar15;
  }
  local_1988[iVar7 >> 3] = local_1988[iVar7 >> 3] | (byte)(1 << ((byte)uVar18 & 7));
  local_1838[(long)iVar15 * 4] = iVar5;
  if (0x7f < (int)uVar24) {
    return 0;
  }
  local_19d0 = (ulong)(uint)((int)local_19d0 - ((int)uVar13 >> 0x1f));
  lVar12 = (long)(int)uVar24;
  uVar24 = uVar24 + 1;
  if ((int)local_19f8 < iVar15) {
    local_19f8 = uVar18;
  }
  *(int *)((long)local_1028 + lVar12 * 0x20 + -4) = iVar15;
  *(uint *)(&local_1030 + lVar12 * 4) = uVar27;
  local_1038[lVar12 * 8] = uVar4;
  local_1038[lVar12 * 8 + 1] = uVar28;
  local_1028[lVar12 * 4] = (long)format;
  local_1028[lVar12 * 4 + 1] = (long)pbVar8;
  format = (char *)input_00;
  local_19b8 = input_00;
  goto switchD_00140182_caseD_68;
code_r0x001400f7:
  local_19b8 = local_19b8 + 1;
  goto switchD_00140182_caseD_68;
}

Assistant:

static int formatf(
  void *userp, /* untouched by format(), just sent to the stream() function in
                  the second argument */
  /* function pointer called for each output character */
  int (*stream)(unsigned char, void *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  static const char nilstr[] = "(nil)";
  const char *digits = lower_digits;   /* Base-36 digits for numbers.  */
  int done = 0;   /* number of characters written  */
  int i;
  int ocount = 0; /* number of output segments */
  int icount = 0; /* number of input arguments */

  struct outsegment output[MAX_SEGMENTS];
  struct va_input input[MAX_PARAMETERS];
  char work[BUFFSIZE];

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (FALSE?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Parse the format string */
  if(parsefmt(format, output, input, &ocount, &icount, ap_save))
    return 0;

  for(i = 0; i < ocount; i++) {
    struct outsegment *optr = &output[i];
    struct va_input *iptr;
    bool is_alt;            /* Format spec modifiers.  */
    int width;              /* Width of a field.  */
    int prec;               /* Precision of a field.  */
    bool is_neg;            /* Decimal integer is negative.  */
    unsigned long base;     /* Base of a number to be written.  */
    mp_uintmax_t num;       /* Integral values to be written.  */
    mp_intmax_t signed_num; /* Used to convert negative in positive.  */
    char *w;
    size_t outlen = optr->outlen;
    unsigned int flags = optr->flags;

    if(outlen) {
      char *str = optr->start;
      for(; outlen && *str; outlen--)
        OUTCHAR(*str++);
      if(optr->flags & FLAGS_SUBSTR)
        /* this is just a substring */
        continue;
    }

    /* pick up the specified width */
    if(flags & FLAGS_WIDTHPARAM) {
      width = (int)input[optr->width].val.nums;
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        if(width == INT_MIN)
          width = INT_MAX;
        else
          width = -width;
        flags |= FLAGS_LEFT;
        flags &= ~(unsigned int)FLAGS_PAD_NIL;
      }
    }
    else
      width = optr->width;

    /* pick up the specified precision */
    if(flags & FLAGS_PRECPARAM) {
      prec = (int)input[optr->precision].val.nums;
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(flags & FLAGS_PREC)
      prec = optr->precision;
    else
      prec = -1;

    is_alt = (flags & FLAGS_ALT) ? 1 : 0;
    iptr = &input[optr->input];

    switch(iptr->type) {
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      flags |= FLAGS_UNSIGNED;
      FALLTHROUGH();
    case FORMAT_INT:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
      num = iptr->val.numu;
      if(flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(flags & FLAGS_OCTAL) {
        /* Octal unsigned integer */
        base = 8;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer */
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        base = 16;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer */
        base = 10;
        is_neg = FALSE;
      }
      else {
        /* Decimal integer.  */
        base = 10;

        is_neg = (iptr->val.nums < (mp_intmax_t)0);
        if(is_neg) {
          /* signed_num might fail to hold absolute negative minimum by 1 */
          signed_num = iptr->val.nums + (mp_intmax_t)1;
          signed_num = -signed_num;
          num = (mp_uintmax_t)signed_num;
          num += (mp_uintmax_t)1;
        }
      }
number:
      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      switch(base) {
      case 10:
        while(num > 0) {
          *w-- = (char)('0' + (num % 10));
          num /= 10;
        }
        break;
      default:
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        break;
      }
      width -= (int)(workend - w);
      prec -= (int)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (flags & FLAGS_SHOWSIGN) || (flags & FLAGS_SPACE))
        --width;

      if(!(flags & FLAGS_LEFT) && !(flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(flags & FLAGS_LEFT) && (flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING: {
      const char *str;
      size_t len;

      str = (char *)iptr->val.str;
      if(!str) {
        /* Write null string if there is space.  */
        if(prec == -1 || prec >= (int) sizeof(nilstr) - 1) {
          str = nilstr;
          len = sizeof(nilstr) - 1;
          /* Disable quotes around (nil) */
          flags &= ~(unsigned int)FLAGS_ALT;
        }
        else {
          str = "";
          len = 0;
        }
      }
      else if(prec != -1)
        len = (size_t)prec;
      else if(*str == '\0')
        len = 0;
      else
        len = strlen(str);

      width -= (len > INT_MAX) ? INT_MAX : (int)len;

      if(flags & FLAGS_ALT)
        OUTCHAR('"');

      if(!(flags & FLAGS_LEFT))
        while(width-- > 0)
          OUTCHAR(' ');

      for(; len && *str; len--)
        OUTCHAR(*str++);
      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');

      if(flags & FLAGS_ALT)
        OUTCHAR('"');
      break;
    }

    case FORMAT_PTR:
      /* Generic pointer.  */
      if(iptr->val.ptr) {
        /* If the pointer is not NULL, write it as a %#x spec.  */
        base = 16;
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        is_alt = TRUE;
        num = (size_t) iptr->val.ptr;
        is_neg = FALSE;
        goto number;
      }
      else {
        /* Write "(nil)" for a nil pointer.  */
        const char *point;

        width -= (int)(sizeof(nilstr) - 1);
        if(flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
        for(point = nilstr; *point != '\0'; ++point)
          OUTCHAR(*point);
        if(!(flags & FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_DOUBLE: {
      char formatbuf[32]="%";
      char *fptr = &formatbuf[1];
      size_t left = sizeof(formatbuf)-strlen(formatbuf);
      int len;

      if(flags & FLAGS_WIDTH)
        width = optr->width;

      if(flags & FLAGS_PREC)
        prec = optr->precision;

      if(flags & FLAGS_LEFT)
        *fptr++ = '-';
      if(flags & FLAGS_SHOWSIGN)
        *fptr++ = '+';
      if(flags & FLAGS_SPACE)
        *fptr++ = ' ';
      if(flags & FLAGS_ALT)
        *fptr++ = '#';

      *fptr = 0;

      if(width >= 0) {
        size_t dlen;
        if(width >= (int)sizeof(work))
          width = sizeof(work)-1;
        /* RECURSIVE USAGE */
        dlen = (size_t)curl_msnprintf(fptr, left, "%d", width);
        fptr += dlen;
        left -= dlen;
      }
      if(prec >= 0) {
        /* for each digit in the integer part, we can have one less
           precision */
        size_t maxprec = sizeof(work) - 2;
        double val = iptr->val.dnum;
        if(width > 0 && prec <= width)
          maxprec -= (size_t)width;
        while(val >= 10.0) {
          val /= 10;
          maxprec--;
        }

        if(prec > (int)maxprec)
          prec = (int)maxprec-1;
        if(prec < 0)
          prec = 0;
        /* RECURSIVE USAGE */
        len = curl_msnprintf(fptr, left, ".%d", prec);
        fptr += len;
      }
      if(flags & FLAGS_LONG)
        *fptr++ = 'l';

      if(flags & FLAGS_FLOATE)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'E' : 'e');
      else if(flags & FLAGS_FLOATG)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'G' : 'g');
      else
        *fptr++ = 'f';

      *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
      /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
         output characters */
#ifdef HAVE_SNPRINTF
      (snprintf)(work, sizeof(work), formatbuf, iptr->val.dnum);
#else
      (sprintf)(work, formatbuf, iptr->val.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
      DEBUGASSERT(strlen(work) <= sizeof(work));
      for(fptr = work; *fptr; fptr++)
        OUTCHAR(*fptr);
      break;
    }

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) iptr->val.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(flags & FLAGS_LONG)
          *(long *) iptr->val.ptr = (long)done;
      else if(!(flags & FLAGS_SHORT))
        *(int *) iptr->val.ptr = (int)done;
      else
        *(short *) iptr->val.ptr = (short)done;
      break;

    default:
      break;
    }
  }
  return done;
}